

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsStateChangePerfTestCases.cpp
# Opt level: O0

ResultStats *
deqp::gls::anon_unknown_1::calculateStats
          (ResultStats *__return_storage_ptr__,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *values)

{
  value_type vVar1;
  size_type sVar2;
  const_reference pvVar3;
  iterator __first;
  iterator __last;
  reference pvVar4;
  unsigned_long *puVar5;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  ResultStats *result;
  int i_2;
  undefined1 local_48 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> sortedValues;
  int n;
  double val;
  int i_1;
  int i;
  deUint64 sum;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *values_local;
  
  memset(__return_storage_ptr__,0,0x28);
  __return_storage_ptr__->min = 0xffffffffffffffff;
  _i_1 = 0;
  val._4_4_ = 0;
  while( true ) {
    sVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(values);
    if ((int)sVar2 <= val._4_4_) break;
    pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (values,(long)val._4_4_);
    _i_1 = *pvVar3 + _i_1;
    val._4_4_ = val._4_4_ + 1;
  }
  auVar7._8_4_ = (int)((ulong)_i_1 >> 0x20);
  auVar7._0_8_ = _i_1;
  auVar7._12_4_ = 0x45300000;
  sVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(values);
  auVar10._8_4_ = (int)(sVar2 >> 0x20);
  auVar10._0_8_ = sVar2;
  auVar10._12_4_ = 0x45300000;
  __return_storage_ptr__->mean =
       ((auVar7._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)_i_1) - 4503599627370496.0)) /
       ((auVar10._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0));
  val._0_4_ = 0;
  while( true ) {
    sVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(values);
    if ((int)sVar2 <= val._0_4_) break;
    pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (values,(long)val._0_4_);
    vVar1 = *pvVar3;
    auVar8._8_4_ = (int)(vVar1 >> 0x20);
    auVar8._0_8_ = vVar1;
    auVar8._12_4_ = 0x45300000;
    dVar6 = (auVar8._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)vVar1) - 4503599627370496.0);
    __return_storage_ptr__->variance =
         (dVar6 - __return_storage_ptr__->mean) * (dVar6 - __return_storage_ptr__->mean) +
         __return_storage_ptr__->variance;
    val._0_4_ = val._0_4_ + 1;
  }
  sVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(values);
  auVar11._8_4_ = (int)(sVar2 >> 0x20);
  auVar11._0_8_ = sVar2;
  auVar11._12_4_ = 0x45300000;
  __return_storage_ptr__->variance =
       __return_storage_ptr__->variance /
       ((auVar11._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0));
  sVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(values);
  sortedValues.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = (int)(sVar2 >> 1);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_48,values);
  __first = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_48);
  __last = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_48);
  std::
  sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )__first._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )__last._M_current);
  pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_48,
                      (long)sortedValues.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
  vVar1 = *pvVar4;
  auVar9._8_4_ = (int)(vVar1 >> 0x20);
  auVar9._0_8_ = vVar1;
  auVar9._12_4_ = 0x45300000;
  __return_storage_ptr__->median =
       (auVar9._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)vVar1) - 4503599627370496.0);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_48);
  result._0_4_ = 0;
  while( true ) {
    sVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(values);
    if ((int)sVar2 <= (int)result) break;
    pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (values,(long)(int)result);
    puVar5 = std::min<unsigned_long>(&__return_storage_ptr__->min,pvVar3);
    __return_storage_ptr__->min = *puVar5;
    pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (values,(long)(int)result);
    puVar5 = std::max<unsigned_long>(&__return_storage_ptr__->max,pvVar3);
    __return_storage_ptr__->max = *puVar5;
    result._0_4_ = (int)result + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

ResultStats calculateStats (const vector<deUint64>& values)
{
	ResultStats result = { 0.0, 0.0, 0.0, 0xFFFFFFFFFFFFFFFFu, 0 };

	deUint64 sum = 0;

	for (int i = 0; i < (int)values.size(); i++)
		sum += values[i];

	result.mean = ((double)sum) / (double)values.size();

	for (int i = 0; i < (int)values.size(); i++)
	{
		const double val = (double)values[i];
		result.variance += (val - result.mean) * (val - result.mean);
	}

	result.variance /= (double)values.size();

	{
		const int n = (int)(values.size()/2);

		vector<deUint64> sortedValues = values;

		std::sort(sortedValues.begin(), sortedValues.end());

		result.median = (double)sortedValues[n];
	}

	for (int i = 0; i < (int)values.size(); i++)
	{
		result.min = std::min(result.min, values[i]);
		result.max = std::max(result.max, values[i]);
	}

	return result;
}